

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::InsertToVarAtDefInTryRegion(GlobOpt *this,Instr *instr,Opnd *dstOpnd)

{
  bool bVar1;
  BOOLEAN BVar2;
  RegOpnd *pRVar3;
  StackSym *sym;
  Region *pRVar4;
  RegionType RVar5;
  
  RVar5 = this->currentRegion->type;
  if ((RVar5 == RegionTypeFinally) || (RVar5 == RegionTypeTry)) {
    bVar1 = IR::Opnd::IsRegOpnd(dstOpnd);
    if (!bVar1) {
      return;
    }
    pRVar3 = IR::Opnd::AsRegOpnd(dstOpnd);
    if ((pRVar3->m_sym->field_0x19 & 0x20) == 0) {
      return;
    }
    pRVar3 = IR::Opnd::AsRegOpnd(dstOpnd);
    if (pRVar3->m_sym->m_type == TyVar) {
      return;
    }
    sym = StackSym::GetVarEquivSym(pRVar3->m_sym,(Func *)0x0);
    pRVar4 = this->currentRegion;
    RVar5 = pRVar4->type;
    if (RVar5 == RegionTypeTry) {
      BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                        (pRVar4->writeThroughSymbolsSet,(sym->super_Sym).m_id);
      if (BVar2 != '\0') goto LAB_00428551;
      pRVar4 = this->currentRegion;
      RVar5 = pRVar4->type;
    }
    if ((RVar5 == RegionTypeFinally) &&
       (BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                          (pRVar4->matchingTryRegion->writeThroughSymbolsSet,(sym->super_Sym).m_id),
       BVar2 != '\0')) {
LAB_00428551:
      pRVar3 = IR::RegOpnd::New(sym,TyVar,instr->m_func);
      ToVar(this,instr->m_next,pRVar3,this->currentBlock,(Value *)0x0,false);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::InsertToVarAtDefInTryRegion(IR::Instr * instr, IR::Opnd * dstOpnd)
{
    if ((this->currentRegion->GetType() == RegionTypeTry || this->currentRegion->GetType() == RegionTypeFinally) &&
        dstOpnd->IsRegOpnd() && dstOpnd->AsRegOpnd()->m_sym->HasByteCodeRegSlot())
    {
        StackSym * sym = dstOpnd->AsRegOpnd()->m_sym;
        if (sym->IsVar())
        {
            return;
        }

        StackSym * varSym = sym->GetVarEquivSym(nullptr);
        if ((this->currentRegion->GetType() == RegionTypeTry && this->currentRegion->writeThroughSymbolsSet->Test(varSym->m_id)) ||
            ((this->currentRegion->GetType() == RegionTypeFinally && this->currentRegion->GetMatchingTryRegion()->writeThroughSymbolsSet->Test(varSym->m_id))))
        {
            IR::RegOpnd * regOpnd = IR::RegOpnd::New(varSym, IRType::TyVar, instr->m_func);
            this->ToVar(instr->m_next, regOpnd, this->currentBlock, NULL, false);
        }
    }
}